

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O1

QSqlTableModel * __thiscall
QSqlRelationalTableModel::relationModel(QSqlRelationalTableModel *this,int column)

{
  long lVar1;
  QRelation *this_00;
  Data *dd;
  long lVar2;
  QRelatedTableModel *pQVar3;
  bool bVar4;
  
  if (-1 < column) {
    if ((ulong)(uint)column < *(ulong *)(*(long *)(this + 8) + 0x2f8)) {
      lVar1 = *(long *)(*(long *)(this + 8) + 0x2f0);
      lVar2 = (ulong)(uint)column * 0x10;
      this_00 = *(QRelation **)(lVar1 + lVar2);
      dd = *(Data **)(lVar1 + 8 + lVar2);
      if (dd != (Data *)0x0) {
        LOCK();
        (dd->weakref)._q_value.super___atomic_base<int>._M_i =
             (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (dd->strongref)._q_value.super___atomic_base<int>._M_i =
             (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (this_00 == (QRelation *)0x0) {
        pQVar3 = (QRelatedTableModel *)0x0;
      }
      else {
        if (((this_00->rel).tName.d.size == 0) || ((this_00->rel).iColumn.d.size == 0)) {
          bVar4 = false;
        }
        else {
          bVar4 = (this_00->rel).dColumn.d.size != 0;
        }
        pQVar3 = (QRelatedTableModel *)0x0;
        if ((bVar4) && (this_00->m_parent != (QSqlRelationalTableModel *)0x0)) {
          if (this_00->model == (QRelatedTableModel *)0x0) {
            QRelation::populateModel(this_00);
          }
          pQVar3 = this_00->model;
        }
      }
      QSharedPointer<QRelation>::deref(dd);
      return &pQVar3->super_QSqlTableModel;
    }
  }
  return (QSqlTableModel *)0x0;
}

Assistant:

QSqlTableModel *QSqlRelationalTableModel::relationModel(int column) const
{
    Q_D(const QSqlRelationalTableModel);
    if (column < 0 || column >= d->relations.size())
        return nullptr;

    auto relation = d->relations.at(column);
    if (!relation || !relation->isValid())
        return nullptr;

    if (!relation->model)
        relation->populateModel();
    return relation->model;
}